

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

int Abc_RecToGia3(Gia_Man_t *pMan,If_Man_t *pIfMan,If_Cut_t *pCut,Vec_Int_t *vLeaves,int fHash)

{
  char cVar1;
  Gia_Man_t *p;
  Vec_Mem_t *pVVar2;
  Gia_Obj_t *pGVar3;
  byte bVar4;
  Lms_Man_t *pLVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  uint *puVar17;
  uint uVar18;
  word *pwVar19;
  ulong uVar20;
  ulong uVar21;
  Gia_Obj_t *pGVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  undefined1 *puVar26;
  uint uVar27;
  bool bVar28;
  bool bVar29;
  uint uCanonPhase;
  word *tLimit;
  int BestPo;
  char pCanonPerm [16];
  uint local_8c;
  Gia_Obj_t *local_88;
  ulong local_80;
  Gia_Obj_t *local_78;
  uint local_6c;
  int local_68;
  int local_64;
  If_Cut_t *local_60;
  Vec_Int_t *local_58;
  If_Man_t *local_50;
  char local_48 [24];
  
  pLVar5 = s_pMan3;
  p = s_pMan3->pGia;
  local_64 = -1;
  local_68 = fHash;
  if (pIfMan->pPars->fCutMin != 1) {
    __assert_fail("pIfMan->pPars->fCutMin == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                  ,0x45a,"int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)")
    ;
  }
  uVar24 = *(uint *)&pCut->field_0x1c;
  local_88 = (Gia_Obj_t *)CONCAT44(local_88._4_4_,uVar24);
  uVar27 = uVar24 >> 0x18;
  uVar14 = (ulong)uVar27;
  local_6c = vLeaves->nSize;
  local_58 = vLeaves;
  if (uVar27 != local_6c) {
    __assert_fail("nLeaves == Vec_IntSize(vLeaves)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                  ,0x45b,"int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)")
    ;
  }
  uVar23 = pCut->iCutFunc;
  if ((int)uVar23 < 0) {
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/if.h"
                  ,0x1ab,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  pGVar12 = (Gia_Obj_t *)pIfMan->puTempW;
  pVVar2 = pIfMan->vTtMem[uVar14];
  local_60 = pCut;
  if (pVVar2 == (Vec_Mem_t *)0x0) {
    pwVar19 = (word *)0x0;
  }
  else {
    uVar18 = uVar23 >> 1;
    if (pVVar2->nEntries <= (int)uVar18) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pwVar19 = pVVar2->ppPages[uVar18 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
              (ulong)(uVar18 & pVVar2->PageMask) * (long)pVVar2->nEntrySize;
  }
  uVar18 = pIfMan->nTruth6Words[uVar14];
  uVar23 = uVar23 & 1;
  if (uVar23 == 0) {
    if (0 < (int)uVar18) {
      uVar9 = 0;
      do {
        *(word *)(&pGVar12->field_0x0 + uVar9 * 8) = pwVar19[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar18 != uVar9);
    }
  }
  else if (0 < (int)uVar18) {
    uVar9 = 0;
    do {
      *(word *)(&pGVar12->field_0x0 + uVar9 * 8) = ~pwVar19[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar18 != uVar9);
  }
  uVar18 = 0;
  if (0xffffff < uVar24) {
    iVar6 = uVar27 - 6;
    uVar7 = 1 << ((byte)iVar6 & 0x1f);
    local_78 = (Gia_Obj_t *)(&pGVar12->field_0x0 + (long)(int)uVar7 * 8);
    if ((int)uVar7 < 2) {
      uVar7 = 1;
    }
    uVar9 = 0;
    uVar18 = 0;
    do {
      bVar4 = (byte)uVar9;
      if (uVar24 < 0x7000000) {
        bVar28 = (s_Truths6Neg[uVar9] &
                 (*(ulong *)pGVar12 >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^ *(ulong *)pGVar12)) ==
                 0;
      }
      else {
        bVar28 = true;
        if (uVar9 < 6) {
          if (iVar6 != 0x1f) {
            lVar25 = 0;
            do {
              bVar28 = ((*(ulong *)(&pGVar12->field_0x0 + lVar25 * 8) >>
                         ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^
                        *(ulong *)(&pGVar12->field_0x0 + lVar25 * 8)) & s_Truths6Neg[uVar9]) == 0;
              if (!bVar28) break;
              bVar29 = (ulong)uVar7 - 1 != lVar25;
              lVar25 = lVar25 + 1;
            } while (bVar29);
          }
        }
        else if (iVar6 != 0x1f) {
          bVar15 = (byte)(uVar9 - 6);
          uVar8 = 1 << (bVar15 & 0x1f);
          uVar21 = 1;
          if (1 < (int)uVar8) {
            uVar21 = (ulong)uVar8;
          }
          puVar26 = &pGVar12->field_0x0 + (long)(int)uVar8 * 8;
          lVar25 = (long)(2 << (bVar15 & 0x1f)) * 8;
          pGVar22 = pGVar12;
          do {
            if (uVar9 - 6 != 0x1f) {
              uVar13 = 0;
              do {
                if (*(long *)(&pGVar22->field_0x0 + uVar13 * 8) != *(long *)(puVar26 + uVar13 * 8))
                {
                  bVar28 = false;
                  goto LAB_002983f2;
                }
                uVar13 = uVar13 + 1;
              } while (uVar21 != uVar13);
            }
            pGVar22 = (Gia_Obj_t *)(&pGVar22->field_0x0 + lVar25);
            puVar26 = puVar26 + lVar25;
          } while (pGVar22 < local_78);
        }
      }
LAB_002983f2:
      uVar8 = 1 << (bVar4 & 0x1f);
      if (bVar28) {
        uVar8 = 0;
      }
      uVar18 = uVar18 | uVar8;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar14);
  }
  if (uVar18 == 0) {
    return uVar23;
  }
  local_80 = uVar14;
  local_50 = pIfMan;
  if ((int)uVar18 < 1) {
    __assert_fail("Supp > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x3f9,"int Abc_TtSuppIsMinBase(int)");
  }
  if ((uVar18 == 1) || ((uVar18 + 1 & uVar18) != 0)) {
    if ((uVar18 & uVar18 - 1) != 0) {
      __assert_fail("Abc_TtSuppOnlyOne(uSupport)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                    ,0x463,
                    "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
    }
    uVar24 = 0;
    do {
      if ((uVar18 >> (uVar24 & 0x1f) & 1) != 0) goto LAB_00298501;
      uVar24 = uVar24 + 1;
    } while (uVar24 != 0x20);
    uVar24 = 0xffffffff;
LAB_00298501:
    if ((-1 < (int)uVar24) && ((int)uVar24 < (int)local_6c)) {
      if (-1 < vLeaves->pArray[uVar24]) {
        return uVar23 ^ vLeaves->pArray[uVar24];
      }
LAB_0029856b:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf5,"int Abc_LitNotCond(int, int)");
    }
  }
  else {
    uVar24 = (uVar18 >> 1 & 0x15555555) + (uVar18 & 0x55555555);
    uVar24 = (uVar24 >> 2 & 0x13333333) + (uVar24 & 0x33333333);
    uVar24 = (uVar24 >> 4 & 0x7070707) + (uVar24 & 0x7070707);
    uVar24 = (uVar24 >> 8 & 0xf000f) + (uVar24 & 0xf000f);
    if ((uVar24 >> 0x10) + (uVar24 & 0xffff) != uVar27) {
      __assert_fail("Gia_WordCountOnes(uSupport) == nLeaves",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                    ,0x466,
                    "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
    }
    If_CutFindBestStruct(pIfMan,pCut,local_48,&local_8c,&local_64);
    if ((long)local_64 < 0) {
      __assert_fail("BestPo >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                    ,0x46a,
                    "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
    }
    if (local_64 < p->vCos->nSize) {
      iVar6 = p->vCos->pArray[local_64];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_0029858a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar12 = p->pObjs + iVar6;
      if (p->vTtNodes == (Vec_Int_t *)0x0) {
        pVVar10 = (Vec_Int_t *)malloc(0x10);
        pVVar10->nCap = 0x100;
        pVVar10->nSize = 0;
        piVar11 = (int *)malloc(0x400);
        pVVar10->pArray = piVar11;
        p->vTtNodes = pVVar10;
      }
      if (((int)(uint)*(undefined8 *)(pGVar12 + -(*(ulong *)pGVar12 & 0x1fffffff)) < 0) ||
         (((uint)*(undefined8 *)(pGVar12 + -(*(ulong *)pGVar12 & 0x1fffffff)) & 0x1fffffff) ==
          0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                      ,0x470,
                      "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
      }
      Gia_ObjCollectInternal(p,pGVar12 + -(*(ulong *)pGVar12 & 0x1fffffff));
      pVVar10 = local_58;
      uVar24 = local_8c;
      if (p->vTtNodes->nSize < 1) {
        __assert_fail("Vec_IntSize(pGia->vTtNodes) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                      ,0x472,
                      "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
      }
      pLVar5->vLabels->nSize = 0;
      if (0xffffff < (uint)local_88) {
        uVar9 = 0;
        do {
          cVar1 = local_48[uVar9];
          if ((cVar1 < '\0') || (pVVar10->nSize <= (int)cVar1)) goto LAB_0029852d;
          uVar27 = pVVar10->pArray[(uint)(int)cVar1];
          if ((int)uVar27 < 0) goto LAB_0029856b;
          Vec_IntPush(pLVar5->vLabels,(uVar24 >> ((uint)uVar9 & 0x1f) & 1) != 0 ^ uVar27);
          uVar9 = uVar9 + 1;
        } while (uVar14 != uVar9);
      }
      pVVar10 = p->vTtNodes;
      lVar25 = 0;
      local_88 = pGVar12;
      do {
        iVar6 = pVVar10->pArray[lVar25];
        if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_0029858a;
        pGVar12 = p->pObjs + iVar6;
        uVar9 = *(ulong *)pGVar12;
        *(ulong *)pGVar12 = uVar9 & 0xffffffffbfffffff;
        uVar21 = (ulong)((uint)uVar9 & 0x1fffffff);
        uVar24 = (uint)*(undefined8 *)(pGVar12 + -uVar21);
        pVVar10 = pLVar5->vLabels;
        if ((~uVar24 & 0x1fffffff) == 0 || (int)uVar24 < 0) {
          if (-1 < (int)uVar24) goto LAB_002985a9;
          uVar24 = (uint)((ulong)*(undefined8 *)(pGVar12 + -uVar21) >> 0x20);
          if (pVVar10->nSize <= (int)(uVar24 & 0x1fffffff)) goto LAB_0029852d;
          uVar21 = (ulong)((uVar24 & 0x1fffffff) << 2);
        }
        else {
          pGVar22 = pGVar12 + -uVar21;
          pGVar3 = p->pObjs;
          if ((pGVar22 < pGVar3) || (pGVar3 + p->nObjs <= pGVar22)) goto LAB_0029854c;
          uVar24 = (int)((long)pGVar22 - (long)pGVar3 >> 2) * -0x55555555;
          if (((int)uVar24 < 0) ||
             (((p->vTtNums->nSize <= (int)uVar24 ||
               (uVar24 = p->vTtNums->pArray[uVar24 & 0x7fffffff] + (int)uVar14, (int)uVar24 < 0)) ||
              (pVVar10->nSize <= (int)uVar24)))) goto LAB_0029852d;
          uVar21 = (ulong)uVar24 << 2;
        }
        uVar24 = *(uint *)(uVar21 + (long)pVVar10->pArray);
        if ((int)uVar24 < 0) goto LAB_0029856b;
        uVar27 = (uint)(uVar9 >> 0x20);
        uVar21 = (ulong)(uVar27 & 0x1fffffff);
        uVar23 = (uint)*(undefined8 *)(pGVar12 + -uVar21);
        pVVar10 = pLVar5->vLabels;
        if ((~uVar23 & 0x1fffffff) == 0 || (int)uVar23 < 0) {
          if (-1 < (int)uVar23) {
LAB_002985a9:
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          uVar23 = (uint)((ulong)*(undefined8 *)(pGVar12 + -uVar21) >> 0x20);
          if (pVVar10->nSize <= (int)(uVar23 & 0x1fffffff)) goto LAB_0029852d;
          puVar17 = (uint *)((ulong)((uVar23 & 0x1fffffff) << 2) + (long)pVVar10->pArray);
        }
        else {
          pGVar22 = pGVar12 + -uVar21;
          pGVar3 = p->pObjs;
          if ((pGVar22 < pGVar3) || (pGVar3 + p->nObjs <= pGVar22)) goto LAB_0029854c;
          uVar23 = (int)((long)pGVar22 - (long)pGVar3 >> 2) * -0x55555555;
          if ((((int)uVar23 < 0) ||
              ((p->vTtNums->nSize <= (int)uVar23 ||
               (uVar23 = p->vTtNums->pArray[uVar23 & 0x7fffffff] + (int)uVar14, (int)uVar23 < 0))))
             || (pVVar10->nSize <= (int)uVar23)) goto LAB_0029852d;
          puVar17 = (uint *)(pVVar10->pArray + uVar23);
        }
        uVar23 = *puVar17;
        if ((int)uVar23 < 0) goto LAB_0029856b;
        uVar18 = (uint)(uVar9 >> 0x1d) & 1 ^ uVar24;
        uVar27 = uVar27 >> 0x1d & 1 ^ uVar23;
        local_78 = pGVar12;
        if (local_68 == 0) {
          pGVar12 = Gia_ManAppendObj(pMan);
          uVar24 = uVar24 >> 1;
          iVar6 = pMan->nObjs;
          if (iVar6 <= (int)uVar24) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x27a,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          uVar23 = uVar23 >> 1;
          if (iVar6 <= (int)uVar23) {
            __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x27b,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          if ((uVar24 == uVar23) && (pMan->fGiaSimple == 0)) {
            __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x27c,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          iVar16 = (int)pGVar12;
          if ((int)uVar18 < (int)uVar27) {
            pGVar22 = pMan->pObjs;
            if ((pGVar12 < pGVar22) || (pGVar22 + iVar6 <= pGVar12)) goto LAB_0029854c;
            uVar14 = *(ulong *)pGVar12;
            uVar9 = (ulong)((uVar18 & 1) << 0x1d |
                           ((uint)(iVar16 - (int)pGVar22) >> 2) * -0x55555555 - uVar24 & 0x1fffffff)
            ;
            *(ulong *)pGVar12 = uVar9 | uVar14 & 0xffffffffc0000000;
            pGVar22 = pMan->pObjs;
            if ((pGVar12 < pGVar22) || (pGVar22 + pMan->nObjs <= pGVar12)) goto LAB_0029854c;
            uVar13 = (ulong)(((uint)(iVar16 - (int)pGVar22) >> 2) * -0x55555555 - uVar23 &
                            0x1fffffff) << 0x20;
            *(ulong *)pGVar12 = uVar9 | uVar14 & 0xe0000000c0000000 | uVar13;
            uVar20 = (ulong)(uVar27 & 1) << 0x3d;
            uVar13 = uVar9 | uVar14 & 0xc0000000c0000000 | uVar13;
          }
          else {
            pGVar22 = pMan->pObjs;
            if ((pGVar12 < pGVar22) || (pGVar22 + iVar6 <= pGVar12)) goto LAB_0029854c;
            uVar9 = (ulong)(((uint)(iVar16 - (int)pGVar22) >> 2) * -0x55555555 - uVar24 & 0x1fffffff
                           ) << 0x20;
            uVar14 = *(ulong *)pGVar12;
            uVar21 = (ulong)(uVar18 & 1) << 0x3d;
            *(ulong *)pGVar12 = uVar21 | uVar14 & 0xc0000000ffffffff | uVar9;
            pGVar22 = pMan->pObjs;
            if ((pGVar12 < pGVar22) || (pGVar22 + pMan->nObjs <= pGVar12)) goto LAB_0029854c;
            uVar13 = (ulong)(((uint)(iVar16 - (int)pGVar22) >> 2) * -0x55555555 - uVar23 &
                            0x1fffffff);
            *(ulong *)pGVar12 = uVar21 | uVar14 & 0xc0000000e0000000 | uVar9 | uVar13;
            uVar20 = (ulong)((uVar27 & 1) << 0x1d);
            uVar13 = uVar21 | uVar14 & 0xc0000000c0000000 | uVar9 | uVar13;
          }
          *(ulong *)pGVar12 = uVar13 | uVar20;
          if (pMan->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(pMan,pGVar12 + -(uVar13 & 0x1fffffff),pGVar12);
            Gia_ObjAddFanout(pMan,pGVar12 + -((ulong)*(uint *)&pGVar12->field_0x4 & 0x1fffffff),
                             pGVar12);
          }
          if (pMan->fSweeper != 0) {
            uVar9 = *(ulong *)pGVar12 & 0x1fffffff;
            uVar14 = *(ulong *)pGVar12 >> 0x20 & 0x1fffffff;
            uVar21 = 0x4000000000000000;
            if (((uint)*(ulong *)(pGVar12 + -uVar9) >> 0x1e & 1) == 0) {
              uVar21 = 0x40000000;
            }
            *(ulong *)(pGVar12 + -uVar9) = uVar21 | *(ulong *)(pGVar12 + -uVar9);
            uVar21 = *(ulong *)(pGVar12 + -uVar14);
            uVar13 = 0x4000000000000000;
            if (((uint)uVar21 >> 0x1e & 1) == 0) {
              uVar13 = 0x40000000;
            }
            *(ulong *)(pGVar12 + -uVar14) = uVar13 | uVar21;
            uVar14 = *(ulong *)pGVar12;
            *(ulong *)pGVar12 =
                 uVar14 & 0x7fffffffffffffff |
                 (ulong)(((uint)(uVar14 >> 0x3d) ^ (uint)(uVar21 >> 0x3f)) &
                        ((uint)((ulong)*(undefined8 *)(pGVar12 + -uVar9) >> 0x3f) ^
                        (uint)(uVar14 >> 0x1d) & 7)) << 0x3f;
          }
          pGVar22 = pMan->pObjs;
          if ((pGVar12 < pGVar22) || (pGVar22 + pMan->nObjs <= pGVar12)) goto LAB_0029854c;
          iVar6 = (int)((ulong)((long)pGVar12 - (long)pGVar22) >> 2) * 0x55555556;
        }
        else {
          iVar6 = Gia_ManHashAnd(pMan,uVar18,uVar27);
        }
        uVar14 = local_80;
        Vec_IntPush(pLVar5->vLabels,iVar6);
        lVar25 = lVar25 + 1;
        pVVar10 = p->vTtNodes;
      } while (lVar25 < pVVar10->nSize);
      if (((int)(uint)*(undefined8 *)local_78 < 0) ||
         (((uint)*(undefined8 *)local_78 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pGiaTemp)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                      ,0x48e,
                      "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
      }
      pGVar12 = p->pObjs;
      if ((local_78 < pGVar12) || (pGVar12 + p->nObjs <= local_78)) {
LAB_0029854c:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar24 = (int)((long)local_78 - (long)pGVar12 >> 2) * -0x55555555;
      if ((((-1 < (int)uVar24) && ((int)uVar24 < p->vTtNums->nSize)) &&
          (uVar24 = p->vTtNums->pArray[uVar24 & 0x7fffffff] + (int)uVar14, -1 < (int)uVar24)) &&
         ((int)uVar24 < pLVar5->vLabels->nSize)) {
        uVar24 = pLVar5->vLabels->pArray[uVar24];
        if (-1 < (int)uVar24) {
          return (local_8c >> ((byte)uVar14 & 0x1f) ^
                 *(uint *)local_88 >> 0x1d ^ *(uint *)&local_60->field_0x1c >> 0xc) & 1 ^ uVar24;
        }
        goto LAB_0029856b;
      }
    }
  }
LAB_0029852d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Abc_RecToGia3( Gia_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, Vec_Int_t * vLeaves, int fHash )
{
    Lms_Man_t * p = s_pMan3;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase;
    int iFan0, iFan1, iGiaObj;
    Gia_Man_t * pGia = p->pGia;
    Gia_Obj_t * pGiaPo, * pGiaTemp = NULL;
    int i, uSupport, BestPo = -1, nLeaves = If_CutLeaveNum(pCut);
    assert( pIfMan->pPars->fCutMin == 1 );
    assert( nLeaves == Vec_IntSize(vLeaves) );

    // compute support
    uSupport = Abc_TtSupport( If_CutTruthW(pIfMan, pCut), nLeaves );
    if ( uSupport == 0 )
        return Abc_LitNotCond( 0, If_CutTruthIsCompl(pCut) );
    if ( !Abc_TtSuppIsMinBase(uSupport) || uSupport == 1 )
    {
        assert( Abc_TtSuppOnlyOne(uSupport) );
        return Abc_LitNotCond( Vec_IntEntry(vLeaves, Abc_TtSuppFindFirst(uSupport)), If_CutTruthIsCompl(pCut) );
    }
    assert( Gia_WordCountOnes(uSupport) == nLeaves );

    // get the best output for this node
    If_CutFindBestStruct( pIfMan, pCut, pCanonPerm, &uCanonPhase, &BestPo );
    assert( BestPo >= 0 );
    pGiaPo = Gia_ManCo( pGia, BestPo );

    // collect internal nodes into pGia->vTtNodes
    if ( pGia->vTtNodes == NULL )
        pGia->vTtNodes = Vec_IntAlloc( 256 );
    assert( Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) ) );
    Gia_ObjCollectInternal( pGia, Gia_ObjFanin0(pGiaPo) );
    assert( Vec_IntSize(pGia->vTtNodes) > 0 );

    // collect GIA nodes for leaves
    Vec_IntClear( p->vLabels );
    for (i = 0; i < nLeaves; i++)
        Vec_IntPush( p->vLabels, Abc_LitNotCond(Vec_IntEntry(vLeaves, pCanonPerm[i]), (uCanonPhase >> i) & 1) );

    // compute HOP nodes for internal nodes
    Gia_ManForEachObjVec( pGia->vTtNodes, pGia, pGiaTemp, i )
    {
        pGiaTemp->fMark0 = 0; // unmark node marked by Gia_ObjCollectInternal()
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pGiaTemp)) )
            iFan0 = Vec_IntEntry(p->vLabels, Gia_ObjNum(pGia, Gia_ObjFanin0(pGiaTemp)) + nLeaves);
        else
            iFan0 = Vec_IntEntry(p->vLabels, Gia_ObjCioId(Gia_ObjFanin0(pGiaTemp)));
        iFan0 = Abc_LitNotCond(iFan0, Gia_ObjFaninC0(pGiaTemp));
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pGiaTemp)) )
            iFan1 = Vec_IntEntry(p->vLabels, Gia_ObjNum(pGia, Gia_ObjFanin1(pGiaTemp)) + nLeaves);
        else
            iFan1 = Vec_IntEntry(p->vLabels, Gia_ObjCioId(Gia_ObjFanin1(pGiaTemp)));
        iFan1 = Abc_LitNotCond(iFan1, Gia_ObjFaninC1(pGiaTemp));
        if ( fHash )
            iGiaObj = Gia_ManHashAnd(pMan, iFan0, iFan1);
        else
            iGiaObj = Gia_ManAppendAnd(pMan, iFan0, iFan1);
        Vec_IntPush(p->vLabels, iGiaObj);
    }
    // get the final result
    assert( Gia_ObjIsAnd(pGiaTemp) );
    iGiaObj = Vec_IntEntry(p->vLabels, Gia_ObjNum(pGia, pGiaTemp) + nLeaves);
    // complement the result if needed
    return Abc_LitNotCond( iGiaObj,  Gia_ObjFaninC0(pGiaPo) ^ ((uCanonPhase >> nLeaves) & 1) ^ pCut->fCompl );    
}